

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O1

void Abc_ObjChangePerform
               (Abc_Obj_t *pObj,Vec_Int_t *vInfo,Vec_Int_t *vFirst,int fUseInv,Vec_Int_t *vTemp,
               Vec_Ptr_t *vFanout,Vec_Ptr_t *vFanout2,Mio_Cell2_t *pCells)

{
  int *piVar1;
  Abc_Obj_t *pNode;
  uint uVar2;
  int iVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  long lVar6;
  long lVar7;
  
  uVar2 = Mio_GateReadCell((Mio_Gate_t *)(pObj->field_5).pData);
  if ((-1 < (int)uVar2) && ((int)uVar2 < vFirst->nSize)) {
    iVar4 = vFirst->pArray[uVar2];
    if (((long)iVar4 < 0) || (vInfo->nSize <= iVar4)) {
LAB_0051a3f0:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    uVar2 = (pObj->vFanins).nSize;
    if (((int)uVar2 < 1) || (piVar1 = vInfo->pArray, (piVar1 + iVar4)[(ulong)uVar2 * 3] == -1)) {
      __assert_fail("iFanin > 0 && pNodeInfo[3*iFanin] != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmArea.c"
                    ,0x11f,
                    "void Abc_ObjChangePerform(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Mio_Cell2_t *)"
                   );
    }
    Abc_NodeCollectFanouts(pObj,vFanout);
    iVar3 = Abc_NodeIsInv(pObj);
    if (iVar3 == 0) {
      Abc_ObjChangeUpdate(pObj,uVar2,pCells,piVar1 + iVar4,vTemp);
    }
    else {
      pAVar5 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
      if (0 < vFanout->nSize) {
        lVar6 = 0;
        do {
          Abc_ObjPatchFanin((Abc_Obj_t *)vFanout->pArray[lVar6],pObj,pAVar5);
          lVar6 = lVar6 + 1;
        } while (lVar6 < vFanout->nSize);
      }
      if ((pObj->vFanouts).nSize != 0) {
        __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmArea.c"
                      ,0x127,
                      "void Abc_ObjChangePerform(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Mio_Cell2_t *)"
                     );
      }
      Abc_NtkDeleteObj(pObj);
      pObj = pAVar5;
    }
    if (fUseInv == 0) {
      pAVar5 = (Abc_Obj_t *)0x0;
    }
    else {
      pAVar5 = Abc_NtkCreateNodeInv(pObj->pNtk,pObj);
    }
    if (0 < vFanout->nSize) {
      lVar6 = 0;
      do {
        pNode = (Abc_Obj_t *)vFanout->pArray[lVar6];
        if (((*(uint *)&pNode->field_0x14 & 0xf) == 7) && (iVar4 = Abc_NodeIsBuf(pNode), iVar4 == 0)
           ) {
          iVar4 = Abc_NodeIsInv(pNode);
          if (iVar4 == 0) {
            iVar4 = Abc_NodeFindFanin(pNode,pObj);
            uVar2 = Mio_GateReadCell((Mio_Gate_t *)(pNode->field_5).pData);
            if (((int)uVar2 < 0) || (vFirst->nSize <= (int)uVar2)) goto LAB_0051a3d1;
            iVar3 = vFirst->pArray[uVar2];
            if (((long)iVar3 < 0) || (vInfo->nSize <= iVar3)) goto LAB_0051a3f0;
            if ((vInfo->pArray + iVar3)[iVar4 * 3] == -1) goto LAB_0051a2d6;
            Abc_ObjChangeUpdate(pNode,iVar4,pCells,vInfo->pArray + iVar3,vTemp);
          }
          else {
            Abc_NodeCollectFanouts(pNode,vFanout2);
            if (0 < vFanout2->nSize) {
              lVar7 = 0;
              do {
                Abc_ObjPatchFanin((Abc_Obj_t *)vFanout2->pArray[lVar7],pNode,pObj);
                lVar7 = lVar7 + 1;
              } while (lVar7 < vFanout2->nSize);
            }
            if ((pNode->vFanouts).nSize != 0) {
              __assert_fail("Abc_ObjFanoutNum(pNext) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmArea.c"
                            ,0x13e,
                            "void Abc_ObjChangePerform(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Mio_Cell2_t *)"
                           );
            }
            Abc_NtkDeleteObj(pNode);
          }
        }
        else {
LAB_0051a2d6:
          Abc_ObjPatchFanin(pNode,pObj,pAVar5);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < vFanout->nSize);
    }
    return;
  }
LAB_0051a3d1:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Abc_ObjChangePerform( Abc_Obj_t * pObj, Vec_Int_t * vInfo, Vec_Int_t * vFirst, int fUseInv, Vec_Int_t * vTemp, Vec_Ptr_t * vFanout, Vec_Ptr_t * vFanout2, Mio_Cell2_t * pCells )
{
    Abc_Obj_t * pNext, * pNext2, * pNodeInv = NULL;
    int iFanCell, iNodeCell = Mio_GateReadCell( (Mio_Gate_t *)pObj->pData );
    int * pFanInfo, * pNodeInfo = Vec_IntEntryP( vInfo, Vec_IntEntry(vFirst, iNodeCell) );
    int i, k, iFanin = Abc_ObjFaninNum(pObj);
    assert( iFanin > 0 && pNodeInfo[3*iFanin] != -1 );
    // update the node
    Abc_NodeCollectFanouts( pObj, vFanout );
    if ( Abc_NodeIsInv(pObj) )
    {
        Abc_Obj_t * pFanin = Abc_ObjFanin0(pObj);
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanout, pNext, k )
            Abc_ObjPatchFanin( pNext, pObj, pFanin );
        assert( Abc_ObjFanoutNum(pObj) == 0 );
        Abc_NtkDeleteObj(pObj);
        pObj = pFanin;
//        assert( fUseInv == 0 );
    }
    else
        Abc_ObjChangeUpdate( pObj, iFanin, pCells, pNodeInfo, vTemp );
    // add inverter if needed
    if ( fUseInv )
        pNodeInv = Abc_NtkCreateNodeInv(pObj->pNtk, pObj);
    // update the fanouts
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanout, pNext, i )
    {
        if ( !Abc_ObjIsNode(pNext) || Abc_NodeIsBuf(pNext) )
        {
            Abc_ObjPatchFanin( pNext, pObj, pNodeInv );
            continue;
        }
        if ( Abc_NodeIsInv(pNext) )
        {
            Abc_NodeCollectFanouts( pNext, vFanout2 );
            Vec_PtrForEachEntry( Abc_Obj_t *, vFanout2, pNext2, k )
                Abc_ObjPatchFanin( pNext2, pNext, pObj );
            assert( Abc_ObjFanoutNum(pNext) == 0 );
            Abc_NtkDeleteObj(pNext);
            continue;
        }
        iFanin   = Abc_NodeFindFanin( pNext, pObj );
        iFanCell = Mio_GateReadCell( (Mio_Gate_t *)pNext->pData );
        pFanInfo = Vec_IntEntryP( vInfo, Vec_IntEntry(vFirst, iFanCell) );
        if ( pFanInfo[3*iFanin] == -1 )
        {
            Abc_ObjPatchFanin( pNext, pObj, pNodeInv );
            continue;
        }
        Abc_ObjChangeUpdate( pNext, iFanin, pCells, pFanInfo, vTemp );
    }
}